

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::initData(PeleLM *this)

{
  Real RVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  Long LVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  long lVar8;
  BoxArray *bxs;
  MultiFab *pMVar9;
  ostream *os_;
  long *in_RDI;
  bool in_stack_00000037;
  PeleLM *in_stack_00000038;
  MultiFab *Divu_new;
  Real new_time;
  Real dtin;
  Real dt;
  MultiFab tmp;
  int i_2;
  int idX_1;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names_1;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plotnames_1;
  PltFileManager pltData_1;
  string velocity_plotfile;
  int in_stack_000007a4;
  int in_stack_000007a8;
  int in_stack_000007ac;
  Geometry *in_stack_000007b0;
  int in_stack_000007bc;
  PltFileManager *in_stack_000007c0;
  MultiArray4<double> *sma;
  DataContainer *lpmfdata;
  ProbParm *lprobparm_1;
  GeometryData geomdata;
  ProbParm *lprobparm;
  Array4<double> *snew_arr;
  Box *box;
  MFIter mfi;
  MultiFab *in_stack_00000af0;
  int iplt;
  int foundSpec;
  string specString;
  int i_1;
  MultiFab speciesPlt;
  int idSpec;
  string firstChars;
  int i;
  int nSpecPlt;
  int idY;
  int idX;
  int idT;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plotnames;
  PltFileManager pltData;
  string pltfile;
  ParmParse pp;
  MultiFab *P_new;
  MultiFab *S_new;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffee98;
  undefined4 uVar10;
  PeleLM *in_stack_ffffffffffffeea0;
  undefined4 in_stack_ffffffffffffeea8;
  undefined4 in_stack_ffffffffffffeeac;
  NavierStokesBase *in_stack_ffffffffffffeeb0;
  int *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeeb8;
  Print *in_stack_ffffffffffffeec0;
  FabArrayBase *in_stack_ffffffffffffeec8;
  Print *in_stack_ffffffffffffeed0;
  Print *this_01;
  BoxArray *in_stack_ffffffffffffeed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeee0;
  anon_class_72_2_87b191dd *in_stack_ffffffffffffeee8;
  undefined7 in_stack_ffffffffffffeef0;
  undefined1 in_stack_ffffffffffffeef7;
  MFIter *in_stack_ffffffffffffef00;
  Print *in_stack_ffffffffffffef08;
  Print *in_stack_ffffffffffffef10;
  undefined8 in_stack_ffffffffffffef18;
  int ival;
  string *in_stack_ffffffffffffef20;
  string *ptr;
  char *in_stack_ffffffffffffef28;
  PeleLM *name;
  ParmParse *in_stack_ffffffffffffef30;
  ParmParse *this_02;
  char *in_stack_ffffffffffffef38;
  allocator *paVar11;
  ParmParse *in_stack_ffffffffffffef40;
  MultiFab *in_stack_fffffffffffff088;
  NavierStokesBase *in_stack_fffffffffffff090;
  int in_stack_fffffffffffff0cc;
  int in_stack_fffffffffffff0d0;
  int in_stack_fffffffffffff0d4;
  Real in_stack_fffffffffffff0d8;
  int in_stack_fffffffffffff0e4;
  MultiFab *in_stack_fffffffffffff0e8;
  AmrLevel *in_stack_fffffffffffff0f0;
  int in_stack_fffffffffffff100;
  undefined1 local_e70 [440];
  int local_cb8;
  int local_cb4;
  string local_c80 [48];
  int in_stack_fffffffffffff3b0;
  int in_stack_fffffffffffff3b4;
  string *in_stack_fffffffffffff3b8;
  Box *in_stack_fffffffffffff3c0;
  MultiFab *in_stack_fffffffffffff3c8;
  string *in_stack_fffffffffffff3d0;
  string local_a08;
  undefined1 local_9e1 [40];
  allocator local_9b9;
  string local_9b8 [32];
  Array4<double> *local_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  ProbParm *local_918;
  DataContainer *local_910;
  Array4<double> *local_908;
  Array4<double> **local_900;
  DataContainer *local_8f8;
  ProbParm *local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  PeleLM *in_stack_fffffffffffff778;
  undefined1 local_870 [64];
  ProbParm *local_830;
  ProbParm *local_828;
  undefined1 local_820 [24];
  Real in_stack_fffffffffffff7f8;
  NavierStokesBase *in_stack_fffffffffffff800;
  undefined1 local_7d4 [28];
  undefined1 *local_7b8;
  MFIter local_7b0;
  undefined1 local_749;
  int local_5c0;
  int local_5bc;
  string local_5b8 [32];
  string local_598 [36];
  int local_574;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  FabArray<amrex::FArrayBox> local_540;
  int local_3bc;
  string local_3b8 [16];
  NavierStokesBase *in_stack_fffffffffffffc58;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  string local_350 [239];
  undefined1 local_261;
  string local_d8 [55];
  allocator local_a1;
  string local_a0 [120];
  MultiFab *local_28;
  PeleLM *local_20;
  char *local_8;
  
  amrex::Gpu::copy<ProbParm*,ProbParm*>(prob_parm,prob_parm + 1,prob_parm_d);
  local_20 = (PeleLM *)
             amrex::AmrLevel::get_new_data
                       ((AmrLevel *)in_stack_ffffffffffffeea0,
                        (int)((ulong)in_stack_ffffffffffffee98 >> 0x20));
  local_28 = amrex::AmrLevel::get_new_data
                       ((AmrLevel *)in_stack_ffffffffffffeea0,
                        (int)((ulong)in_stack_ffffffffffffee98 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"peleLM",&local_a1);
  amrex::ParmParse::ParmParse
            ((ParmParse *)in_stack_ffffffffffffeeb0,
             (string *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  iVar4 = amrex::ParmParse::countval
                    (in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
                     (int)((ulong)in_stack_ffffffffffffef30 >> 0x20));
  ival = (int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
  if (iVar4 < 1) {
    amrex::Geometry::data((Geometry *)in_stack_ffffffffffffeeb0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffeea0,
               (value_type)in_stack_ffffffffffffee98);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffeea0,
               (value_type)in_stack_ffffffffffffee98);
    local_8f0 = prob_parm_d;
    local_8f8 = pele::physics::PMF::PmfData::getDeviceData(&pmf_data);
    local_998 = (Array4<double> *)
                amrex::FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                          (in_stack_ffffffffffffee98);
    local_900 = &local_908;
    local_940 = local_898;
    uStack_938 = uStack_890;
    local_950 = local_8a8;
    uStack_948 = uStack_8a0;
    local_960 = local_8b8;
    uStack_958 = uStack_8b0;
    local_970 = local_8c8;
    uStack_968 = uStack_8c0;
    local_980 = local_8d8;
    uStack_978 = uStack_8d0;
    local_990 = local_8e8;
    uStack_988 = uStack_8e0;
    local_918 = local_8f0;
    local_910 = local_8f8;
    local_908 = local_998;
    amrex::experimental::ParallelFor<amrex::MultiFab,PeleLM::initData()::__1>
              ((MultiFab *)in_stack_ffffffffffffeeb0,
               (anon_class_144_4_1714b3b6 *)
               CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
  }
  else {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffeea0,
               (value_type)in_stack_ffffffffffffee98);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffeea0,
               (value_type)in_stack_ffffffffffffee98);
    std::__cxx11::string::string(local_d8);
    amrex::ParmParse::query
              (in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,
               (int)((ulong)in_stack_ffffffffffffef18 >> 0x20));
    if (NavierStokesBase::verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeed0,(ostream *)in_stack_ffffffffffffeec8);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffeea0,(char (*) [30])in_stack_ffffffffffffee98);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffeea0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee98);
      local_261 = 10;
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffef10);
    }
    std::__cxx11::string::string(local_350,local_d8);
    pele::physics::pltfilemanager::PltFileManager::PltFileManager
              ((PltFileManager *)in_stack_ffffffffffffef10,(string *)in_stack_ffffffffffffef08);
    std::__cxx11::string::~string(local_350);
    pele::physics::pltfilemanager::PltFileManager::getVariableList_abi_cxx11_
              ((PltFileManager *)in_stack_ffffffffffffee98);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4ee325);
    pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
              ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x4ee332);
    local_388 = -1;
    local_38c = -1;
    local_390 = 0;
    for (local_394 = 0;
        LVar5 = amrex::
                Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x4ee388), local_394 < LVar5; local_394 = local_394 + 1) {
      pbVar6 = amrex::
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
      std::__cxx11::string::substr((ulong)local_3b8,(ulong)pbVar6);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98);
      if (bVar2) {
        local_388 = local_394;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98);
      if (bVar2) {
        local_390 = local_390 + 1;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98);
      if ((bVar2) && (local_38c < 0)) {
        local_38c = local_394;
      }
      std::__cxx11::string::~string(local_3b8);
    }
    local_3bc = local_388 + 3;
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (in_stack_000007c0,in_stack_000007bc,in_stack_000007b0,in_stack_000007ac,
               in_stack_000007a8,in_stack_000007a4,in_stack_00000af0);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (in_stack_000007c0,in_stack_000007bc,in_stack_000007b0,in_stack_000007ac,
               in_stack_000007a8,in_stack_000007a4,in_stack_00000af0);
    local_558 = 0;
    uStack_550 = 0;
    local_568 = 0;
    uStack_560 = 0;
    local_548 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x4ee679);
    local_570 = 0;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffeea0);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
               (DistributionMapping *)in_stack_ffffffffffffeed0,
               (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),(int)in_stack_ffffffffffffeec8,
               (MFInfo *)in_stack_ffffffffffffeec0,
               (FabFactory<amrex::FArrayBox> *)
               CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x4ee6e6);
    amrex::MFInfo::~MFInfo((MFInfo *)0x4ee6f3);
    in_stack_ffffffffffffee98 = &local_540;
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (in_stack_000007c0,in_stack_000007bc,in_stack_000007b0,in_stack_000007ac,
               in_stack_000007a8,in_stack_000007a4,in_stack_00000af0);
    for (local_574 = 0; local_574 < 0x15; local_574 = local_574 + 1) {
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
      std::operator+((char *)in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
                     (char *)in_stack_ffffffffffffeea0);
      std::__cxx11::string::~string(local_5b8);
      local_5bc = 0;
      for (local_5c0 = 0; local_5c0 < local_390; local_5c0 = local_5c0 + 1) {
        amrex::
        Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
        if (_Var3) {
          amrex::MultiFab::Copy
                    ((MultiFab *)in_stack_ffffffffffffeed0,(MultiFab *)in_stack_ffffffffffffeec8,
                     (int)((ulong)in_stack_ffffffffffffeec0 >> 0x20),(int)in_stack_ffffffffffffeec0,
                     (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20),(int)in_stack_ffffffffffffeeb8)
          ;
          local_5bc = 1;
        }
      }
      if (local_5bc == 0) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffeed0,
                   (value_type)in_stack_ffffffffffffeec8,
                   (int)((ulong)in_stack_ffffffffffffeec0 >> 0x20),(int)in_stack_ffffffffffffeec0,
                   (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20));
      }
      std::__cxx11::string::~string(local_598);
    }
    if (NavierStokesBase::verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeed0,(ostream *)in_stack_ffffffffffffeec8);
      amrex::Print::operator<<
                ((Print *)in_stack_ffffffffffffeea0,(char (*) [37])in_stack_ffffffffffffee98);
      local_749 = 10;
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffef10);
    }
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
               SUB81((ulong)in_stack_ffffffffffffeec0 >> 0x38,0));
    while( true ) {
      bVar2 = amrex::MFIter::isValid(&local_7b0);
      ival = (int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
      if (!bVar2) break;
      amrex::MFIter::tilebox(in_stack_ffffffffffffef00);
      local_7b8 = local_7d4;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
                 (MFIter *)in_stack_ffffffffffffeea0);
      local_828 = prob_parm_d;
      memcpy(local_870,local_820,0x3c);
      local_830 = local_828;
      amrex::ParallelFor<PeleLM::initData()::__0>
                ((Box *)CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0),
                 in_stack_ffffffffffffeee8);
      amrex::MFIter::operator++(&local_7b0);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffeea0);
    amrex::MultiFab::~MultiFab((MultiFab *)0x4eeb11);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x4eeb1e);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x4eeb2b);
    pele::physics::pltfilemanager::PltFileManager::~PltFileManager
              ((PltFileManager *)in_stack_ffffffffffffeea0);
    std::__cxx11::string::~string(local_d8);
  }
  paVar11 = &local_9b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"1D",paVar11);
  this_02 = (ParmParse *)local_9e1;
  name = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_9e1 + 1),"1D_S",(allocator *)this_02);
  showMFsub(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
            in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0);
  std::__cxx11::string::~string((string *)(local_9e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_9e1);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
  amrex::StateData::curTime((StateData *)in_stack_ffffffffffffeec0);
  NavierStokesBase::computeGradP(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  ptr = &local_a08;
  std::__cxx11::string::string((string *)ptr);
  amrex::ParmParse::query(this_02,(char *)name,ptr,ival);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    if (NavierStokesBase::verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeed0,(ostream *)in_stack_ffffffffffffeec8);
      in_stack_ffffffffffffef10 =
           amrex::Print::operator<<
                     ((Print *)in_stack_ffffffffffffeea0,(char (*) [34])in_stack_ffffffffffffee98);
      in_stack_ffffffffffffef08 =
           amrex::Print::operator<<
                     ((Print *)in_stack_ffffffffffffeea0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffee98);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffef10);
    }
    std::__cxx11::string::string(local_c80,(string *)&local_a08);
    pele::physics::pltfilemanager::PltFileManager::PltFileManager
              ((PltFileManager *)in_stack_ffffffffffffef10,(string *)in_stack_ffffffffffffef08);
    std::__cxx11::string::~string(local_c80);
    pele::physics::pltfilemanager::PltFileManager::getVariableList_abi_cxx11_
              ((PltFileManager *)in_stack_ffffffffffffee98);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4ef003);
    pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
              ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x4ef00d);
    local_cb4 = -1;
    for (local_cb8 = 0; lVar8 = (long)local_cb8,
        LVar5 = amrex::
                Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x4ef03f), lVar8 < LVar5; local_cb8 = local_cb8 + 1) {
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
      in_stack_ffffffffffffeef7 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98);
      if ((bool)in_stack_ffffffffffffeef7) {
        local_cb4 = local_cb8;
      }
    }
    if (local_cb4 == -1) {
      local_8 = "Could not find velocity fields in supplied peleLM.initVelocityPlt";
      amrex::Abort_host((char *)in_stack_ffffffffffffeeb0);
    }
    bxs = amrex::FabArrayBase::boxArray((FabArrayBase *)local_20);
    pMVar9 = (MultiFab *)amrex::FabArrayBase::DistributionMap((FabArrayBase *)local_20);
    local_e70._24_8_ = 0;
    local_e70._32_8_ = 0;
    local_e70._8_8_ = (ostream *)0x0;
    local_e70._16_8_ = 0;
    local_e70._40_8_ = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x4ef185);
    local_e70._0_4_ = 0;
    local_e70._4_4_ = 0;
    this_01 = (Print *)local_e70;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffeea0);
    amrex::MultiFab::MultiFab
              (pMVar9,bxs,(DistributionMapping *)this_01,
               (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),(int)in_stack_ffffffffffffeec8,
               (MFInfo *)in_stack_ffffffffffffeec0,
               (FabFactory<amrex::FArrayBox> *)
               CONCAT17(in_stack_ffffffffffffeef7,in_stack_ffffffffffffeef0));
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x4ef1e1);
    amrex::MFInfo::~MFInfo((MFInfo *)0x4ef1ee);
    in_stack_ffffffffffffee98 = (FabArray<amrex::FArrayBox> *)(local_e70 + 0x38);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              (in_stack_000007c0,in_stack_000007bc,in_stack_000007b0,in_stack_000007ac,
               in_stack_000007a8,in_stack_000007a4,in_stack_00000af0);
    amrex::MultiFab::Add
              ((MultiFab *)in_stack_ffffffffffffeeb0,
               (MultiFab *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
               (int)((ulong)in_stack_ffffffffffffeea0 >> 0x20),(int)in_stack_ffffffffffffeea0,
               (int)((ulong)in_stack_ffffffffffffee98 >> 0x20),(int)in_stack_ffffffffffffee98);
    if (NavierStokesBase::verbose != 0) {
      os_ = amrex::OutStream();
      amrex::Print::Print(this_01,os_);
      in_stack_ffffffffffffeec0 =
           amrex::Print::operator<<
                     ((Print *)in_stack_ffffffffffffeea0,(char (*) [52])in_stack_ffffffffffffee98);
      amrex::Print::operator<<((Print *)in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98)
      ;
      amrex::Print::~Print(in_stack_ffffffffffffef10);
    }
    amrex::MultiFab::~MultiFab((MultiFab *)0x4ef33c);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x4ef349);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x4ef356);
    pele::physics::pltfilemanager::PltFileManager::~PltFileManager
              ((PltFileManager *)in_stack_ffffffffffffeea0);
  }
  NavierStokesBase::make_rho_prev_time(in_stack_ffffffffffffeeb0);
  NavierStokesBase::make_rho_curr_time(in_stack_ffffffffffffeeb0);
  initDataOtherTypes(in_stack_ffffffffffffeea0);
  NavierStokesBase::set_body_state(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
  set_typical_values(in_stack_00000038,in_stack_00000037);
  init_mixture_fraction();
  initActiveControl(in_stack_fffffffffffff778);
  NavierStokesBase::InitialRedistribution(in_stack_fffffffffffffc58);
  NavierStokesBase::set_body_state(in_stack_fffffffffffff090,in_stack_fffffffffffff088);
  if (NavierStokesBase::have_divu != 0) {
    this_00 = &NavierStokesBase::Divu_Type;
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
    RVar1 = amrex::StateData::curTime((StateData *)in_stack_ffffffffffffeec0);
    pMVar9 = amrex::AmrLevel::get_new_data
                       ((AmrLevel *)in_stack_ffffffffffffeea0,
                        (int)((ulong)in_stack_ffffffffffffee98 >> 0x20));
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_ffffffffffffeea0,(size_type)in_stack_ffffffffffffee98);
    amrex::StateData::setTimeLevel
              ((StateData *)this_00,
               (Real)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8),
               (Real)in_stack_ffffffffffffeea0,(Real)in_stack_ffffffffffffee98);
    uVar10 = (undefined4)((ulong)in_stack_ffffffffffffee98 >> 0x20);
    in_stack_ffffffffffffeea0 = local_20;
    amrex::FabArrayBase::nGrow((FabArrayBase *)local_20,0);
    in_stack_ffffffffffffee98 = (FabArray<amrex::FArrayBox> *)CONCAT44(uVar10,3);
    amrex::AmrLevel::FillPatch
              (in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e4,
               in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d4,in_stack_fffffffffffff0d0,
               in_stack_fffffffffffff0cc,in_stack_fffffffffffff100);
    (**(code **)(*in_RDI + 0x178))(SUB84(RVar1,0));
    (**(code **)(*in_RDI + 0x168))(SUB84(RVar1,0),0,in_RDI,pMVar9);
  }
  amrex::BoxArray::operator=
            ((BoxArray *)in_stack_ffffffffffffeea0,(BoxArray *)in_stack_ffffffffffffee98);
  std::__cxx11::string::~string((string *)&local_a08);
  amrex::ParmParse::~ParmParse((ParmParse *)0x4ef5c4);
  return;
}

Assistant:

void
PeleLM::initData ()
{
  //
  // Copy problem parameters into device copy
  //
  Gpu::copy(Gpu::hostToDevice, prob_parm, prob_parm+1,
            prob_parm_d);

  //
  // Initialize the state and the pressure.
  //
  MultiFab&   S_new    = get_new_data(State_Type);
  MultiFab&   P_new    = get_new_data(Press_Type);

  // If the user provide an initDataPlt, fill the data from there.
  ParmParse pp("peleLM");
  if (pp.countval("initDataPlt") > 0) {

    //
    // This code has a few drawbacks.  It assumes that the physical
    // domain size of the current problem is the same as that of the
    // one that generated the pltfile.  It also assumes that the pltfile
    // has at least as many levels as does the current problem.  If
    // either of these are false this code is likely to core dump.
    //
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    std::string pltfile;
    pp.query("initDataPlt", pltfile);
    if (verbose)
      amrex::Print() << "initData: reading data from: " << pltfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(pltfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idT = -1, idX = -1, idY = -1, nSpecPlt = 0;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      std::string firstChars = plotnames[i].substr(0, 2);
      if (plotnames[i] == "temp")       idT = i;
      if (plotnames[i] == "x_velocity") idX = i;
      if (firstChars == "Y(")     nSpecPlt += 1;
      if (firstChars == "Y(" && idY < 0 ) {  // species might not be ordered in the order of the current mech.
        idY = i;
      }
    }
    //
    // In the plotfile the mass fractions directly follow the velocities.
    //
    int idSpec = idX + AMREX_SPACEDIM;
 
    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, Xvel, AMREX_SPACEDIM,
                             S_new);

    // Temperature
    pltData.fillPatchFromPlt(level, geom, idT, Temp, 1,
                             S_new);

    // Species
    // Hold the species in temporary MF before copying to level data
    // in case the number of species differs.
    MultiFab speciesPlt(grids, dmap, nSpecPlt, 0); 
    pltData.fillPatchFromPlt(level, geom, idSpec, 0, nSpecPlt,
                             speciesPlt);
    for (int i = 0; i < NUM_SPECIES; i++) {
       std::string specString = "Y("+spec_names[i]+")";
       int foundSpec = 0;
       for (int iplt = 0; iplt < nSpecPlt; iplt++) {
          if ( specString == plotnames[idY+iplt] ) {
             MultiFab::Copy(S_new, speciesPlt, iplt, DEF_first_spec+i, 1, 0);
             foundSpec = 1;
          }
       }
       if (!foundSpec) S_new.setVal(0.0,DEF_first_spec+i,1);
    }

    if (verbose) amrex::Print() << "initData: finished init from pltfile" << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
      const Box& box = mfi.tilebox();
      auto const& snew_arr = S_new.array(mfi);
      ProbParm const* lprobparm = prob_parm_d;

      amrex::ParallelFor(box,
      [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
        amrex::Real massfrac[NUM_SPECIES] = {0.0};
        for (int n = 0; n < NUM_SPECIES; n++) {
          massfrac[n] = snew_arr(i,j,k,DEF_first_spec+n);
        }
        auto eos = pele::physics::PhysicsType::eos();

        amrex::Real rho_cgs, P_cgs;
        P_cgs = lprobparm->P_mean * 10.0;

        eos.PYT2R(P_cgs, massfrac, snew_arr(i,j,k,DEF_Temp), rho_cgs);
        snew_arr(i,j,k,Density) = rho_cgs * 1.0e3;            // CGS -> MKS conversion

        eos.TY2H(snew_arr(i,j,k,DEF_Temp), massfrac, snew_arr(i,j,k,DEF_RhoH));
        snew_arr(i,j,k,DEF_RhoH) = snew_arr(i,j,k,DEF_RhoH) * 1.0e-4 * snew_arr(i,j,k,Density);   // CGS -> MKS conversion

        for (int n = 0; n < NUM_SPECIES; n++) {
          snew_arr(i,j,k,DEF_first_spec+n) = massfrac[n] * snew_arr(i,j,k,Density);
        }
      });
    }
  }
  else {
    const auto geomdata = geom.data();
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    ProbParm const* lprobparm = prob_parm_d;
    pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();

    auto const& sma = S_new.arrays();
    amrex::ParallelFor(S_new,
    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
       pelelm_initdata(i, j, k, sma[box_no], geomdata, *lprobparm, lpmfdata);
    });
  }

  showMFsub("1D",S_new,stripBox,"1D_S",level);

  //
  // Initialize GradP
  //
  computeGradP(state[Press_Type].curTime());

  //
  // We might want to add the velocity from the supplied plotfile
  // to what we already put into the velocity field via init_data
  //
  std::string velocity_plotfile;
  pp.query("initVelocityPlt", velocity_plotfile);

  if (!velocity_plotfile.empty()) {
    if (verbose)
      amrex::Print() << "initData: reading velocity from: " << velocity_plotfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(velocity_plotfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idX = -1;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      if (plotnames[i] == "x_velocity") idX = i;
    }
    if (idX == -1)
      amrex::Abort("Could not find velocity fields in supplied peleLM.initVelocityPlt");
 
    MultiFab tmp(S_new.boxArray(), S_new.DistributionMap(), 1, 0);

    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, 0, AMREX_SPACEDIM,
                             tmp);
    MultiFab::Add(S_new,tmp,0,Xvel,AMREX_SPACEDIM,0);

    if (verbose)
      amrex::Print() << "initData: finished init from peleLM.initVelocityPlt" << '\n';
  }

  make_rho_prev_time();
  make_rho_curr_time();

  //
  // Initialize other types (RhoRT, divu, ...)
  //
  initDataOtherTypes();

  // Initialize state for EB covered regions.
#ifdef AMREX_USE_EB
  set_body_state(S_new);
#endif

  //
  // Load typical values for each state component
  //
  set_typical_values(false);

  //
  // Initialize mixture fraction data.
  //
  init_mixture_fraction();

  //
  // Initialize active control
  //
  initActiveControl();

#ifdef AMREX_USE_EB
  //
  // Perform redistribution on initial fields
  // This changes the input velocity fields
  //
  InitialRedistribution();
  set_body_state(S_new);
#endif

  //
  // Initialize divU
  //
  if (have_divu)
  {
    const Real dt       = 1.0;
    const Real dtin     = -1.0; // Dummy value denotes initialization.
    const Real new_time = state[Divu_Type].curTime();
    MultiFab&  Divu_new = get_new_data(Divu_Type);

    state[State_Type].setTimeLevel(new_time, dt, dt);

    // calcDiff uses class state and assumes FillPatched -> do it now
    FillPatch(*this, S_new, S_new.nGrow(), new_time , State_Type, Density, NUM_STATE-(Density+1), Density);
    calcDiffusivity(new_time);

    calc_divu(new_time, dtin, Divu_new);
  }

  old_intersect_new = grids;

#ifdef AMREX_PARTICLES
  NavierStokesBase::initParticleData();
#endif
}